

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Ptr_t * Aig_ManDfsAll(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  void ***local_38;
  
  Aig_ManIncrementTravId(p);
  iVar1 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    pAVar7 = p->pConst1;
    pAVar7->TravId = p->nTravIds;
    ppvVar5 = (void **)malloc(0x80);
    vNodes->pArray = ppvVar5;
    vNodes->nCap = 0x10;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar4 << 3);
    vNodes->pArray = ppvVar5;
    pAVar7 = p->pConst1;
    pAVar7->TravId = p->nTravIds;
  }
  local_38 = &vNodes->pArray;
  vNodes->nSize = 1;
  *ppvVar5 = pAVar7;
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      Aig_ManDfsAll_rec(p,(Aig_Obj_t *)pVVar6->pArray[lVar8],vNodes);
      lVar8 = lVar8 + 1;
      pVVar6 = p->vCos;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar8];
      if (*(int *)((long)pvVar3 + 0x20) != p->nTravIds) {
        uVar2 = vNodes->nSize;
        if (uVar2 == vNodes->nCap) {
          if ((int)uVar2 < 0x10) {
            if (*local_38 == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(*local_38,0x80);
            }
            vNodes->pArray = ppvVar5;
            vNodes->nCap = 0x10;
          }
          else {
            if (*local_38 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(*local_38,(ulong)uVar2 << 4);
            }
            vNodes->pArray = ppvVar5;
            vNodes->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar5 = *local_38;
        }
        iVar1 = vNodes->nSize;
        vNodes->nSize = iVar1 + 1;
        ppvVar5[iVar1] = pvVar3;
        pVVar6 = p->vCis;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
  }
  if (vNodes->nSize == p->vObjs->nSize - p->nDeleted) {
    return vNodes;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                ,0xf4,"Vec_Ptr_t *Aig_ManDfsAll(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Aig_ManDfsAll( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsAll_rec( p, pObj, vNodes );
    Aig_ManForEachCi( p, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vNodes, pObj );
    assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}